

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

void Msat_SolverUndoOne(Msat_Solver_t *p)

{
  uint uVar1;
  int Var_00;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Msat_Var_t Var;
  Msat_Lit_t Lit;
  Msat_Solver_t *p_local;
  
  uVar1 = Msat_IntVecPop(p->vTrail);
  Var_00 = (int)uVar1 >> 1;
  p->pAssigns[Var_00] = -1;
  p->pReasons[Var_00] = (Msat_Clause_t *)0x0;
  p->pLevel[Var_00] = -1;
  Msat_OrderVarUnassigned(p->pOrder,Var_00);
  if (p->fVerbose != 0) {
    iVar2 = Msat_SolverReadDecisionLevel(p);
    uVar3 = Msat_SolverReadDecisionLevel(p);
    pcVar4 = "";
    if ((uVar1 & 1) != 0) {
      pcVar4 = "-";
    }
    printf("%-*dunbind(%s%d)\n",(ulong)(iVar2 * 3 + 3),(ulong)uVar3,pcVar4,(ulong)(Var_00 + 1));
  }
  return;
}

Assistant:

void Msat_SolverUndoOne( Msat_Solver_t * p )
{
    Msat_Lit_t Lit;
    Msat_Var_t Var;
    Lit = Msat_IntVecPop( p->vTrail ); 
    Var = MSAT_LIT2VAR(Lit);
    p->pAssigns[Var] = MSAT_VAR_UNASSIGNED;
    p->pReasons[Var] = NULL;
    p->pLevel[Var]   = -1;
//    Msat_OrderUndo( p->pOrder, Var );
    Msat_OrderVarUnassigned( p->pOrder, Var );

    if ( p->fVerbose )
        printf(L_IND"unbind("L_LIT")\n", L_ind, L_lit(Lit)); 
}